

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeakForAllocationStage
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,uchar allocation_stage)

{
  size_t *psVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *node;
  unsigned_long i;
  uchar allocation_stage_local;
  MemoryLeakDetectorNode *leak_local;
  MemoryLeakDetectorTable *this_local;
  
  node = (MemoryLeakDetectorNode *)hash(this,leak->memory_);
  pMVar2 = MemoryLeakDetectorList::getNextLeakForAllocationStage
                     (this->table_ + (long)node,leak,allocation_stage);
  while( true ) {
    if (pMVar2 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar2;
    }
    psVar1 = &node->size_;
    node = (MemoryLeakDetectorNode *)((long)psVar1 + 1);
    if ((MemoryLeakDetectorNode *)0x48 < node) break;
    pMVar2 = MemoryLeakDetectorList::getFirstLeakForAllocationStage
                       (this->table_ + (long)((long)psVar1 + 1),allocation_stage);
  }
  return (MemoryLeakDetectorNode *)0x0;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeakForAllocationStage(MemoryLeakDetectorNode* leak, unsigned char allocation_stage)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeakForAllocationStage(leak, allocation_stage);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}